

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O1

ON_ClippingRegionPoints * __thiscall
ON_ClippingRegionPoints::operator=(ON_ClippingRegionPoints *this,ON_ClippingRegionPoints *src)

{
  uint *puVar1;
  ON_3dPoint *pOVar2;
  uint uVar3;
  double dVar4;
  double *pdVar5;
  uint *puVar6;
  ON_3dPoint *pOVar7;
  uint *puVar8;
  ON_3dPoint *pOVar9;
  
  if (this != src) {
    this->m_point_count = 0;
    this->m_and_clip_flags = 0;
    this->m_or_clip_flags = 0;
    if ((((ulong)src->m_point_count != 0) && (src->m_clip_points != (ON_3dPoint *)0x0)) &&
       (src->m_clip_flags != (uint *)0x0)) {
      ReserveBufferPointCapacity(this,(ulong)src->m_point_count);
      if ((ulong)src->m_point_count != 0) {
        puVar6 = this->m_clip_flags;
        puVar1 = puVar6 + src->m_point_count;
        puVar8 = src->m_clip_flags;
        do {
          uVar3 = *puVar8;
          puVar8 = puVar8 + 1;
          *puVar6 = uVar3;
          puVar6 = puVar6 + 1;
        } while (puVar6 < puVar1);
      }
      if ((ulong)src->m_point_count != 0) {
        pOVar7 = this->m_clip_points;
        pOVar2 = pOVar7 + src->m_point_count;
        pOVar9 = src->m_clip_points;
        do {
          pOVar7->z = pOVar9->z;
          pdVar5 = &pOVar9->x;
          dVar4 = pOVar9->y;
          pOVar9 = pOVar9 + 1;
          pOVar7->x = *pdVar5;
          pOVar7->y = dVar4;
          pOVar7 = pOVar7 + 1;
        } while (pOVar7 < pOVar2);
      }
      this->m_point_count = src->m_point_count;
      this->m_point_capacity = src->m_point_capacity;
      this->m_clip_points = src->m_clip_points;
      this->m_clip_flags = src->m_clip_flags;
      this->m_and_clip_flags = src->m_and_clip_flags;
      this->m_or_clip_flags = src->m_or_clip_flags;
    }
  }
  return this;
}

Assistant:

ON_ClippingRegionPoints& ON_ClippingRegionPoints::operator=(const ON_ClippingRegionPoints& src)
{
  if (this != &src)
  {
    Clear();
    if (src.m_point_count > 0 && nullptr != src.m_clip_points && nullptr != src.m_clip_flags)
    {
      ReserveBufferPointCapacity(src.m_point_count);

      const unsigned int* src_f = src.m_clip_flags;
      unsigned int* f = m_clip_flags;
      unsigned int* f1 = f + src.m_point_count;
      while (f < f1 )
        *f++ = *src_f++;

      const ON_3dPoint* src_p = src.m_clip_points;
      ON_3dPoint* p = m_clip_points;
      ON_3dPoint* p1 = p + src.m_point_count;
      while (p < p1)
        *p++ = *src_p++;

      m_point_count = src.m_point_count;
      m_point_capacity = src.m_point_capacity;
      m_clip_points = src.m_clip_points;
      m_clip_flags = src.m_clip_flags;
      m_and_clip_flags = src.m_and_clip_flags;
      m_or_clip_flags = src.m_or_clip_flags;
    }
  }
  return *this;
}